

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v6::internal::
     handle_dynamic_spec<fmt::v6::internal::width_checker,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
               (int *value,arg_ref<char> ref,
               basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
               *ctx)

{
  int iVar1;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> *in_RSI;
  int *in_RDI;
  int in_stack_00000008;
  basic_string_view<char> in_stack_00000010;
  undefined8 in_stack_ffffffffffffff58;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
  *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff84;
  
  if (in_stack_00000008 != 0) {
    if (in_stack_00000008 == 1) {
      basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::arg
                (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::
      error_handler(in_RSI);
      iVar1 = get_dynamic_spec<fmt::v6::internal::width_checker,fmt::v6::basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>,fmt::v6::internal::error_handler>
                        ();
      *in_RDI = iVar1;
    }
    else if (in_stack_00000008 == 2) {
      basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::arg
                ((basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
                  *)CONCAT44(in_stack_ffffffffffffff84,2),in_stack_00000010);
      basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::
      error_handler(in_RSI);
      iVar1 = get_dynamic_spec<fmt::v6::internal::width_checker,fmt::v6::basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>,fmt::v6::internal::error_handler>
                        ();
      *in_RDI = iVar1;
    }
  }
  return;
}

Assistant:

void handle_dynamic_spec(int& value, arg_ref<typename Context::char_type> ref,
                         Context& ctx) {
  switch (ref.kind) {
  case arg_id_kind::none:
    break;
  case arg_id_kind::index:
    value = internal::get_dynamic_spec<Handler>(ctx.arg(ref.val.index),
                                                ctx.error_handler());
    break;
  case arg_id_kind::name:
    value = internal::get_dynamic_spec<Handler>(ctx.arg(ref.val.name),
                                                ctx.error_handler());
    break;
  }
}